

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int utf8_isInvalid3(ENCODING *UNUSED_enc,char *p)

{
  bool local_19;
  char *p_local;
  ENCODING *UNUSED_enc_local;
  
  local_19 = true;
  if ((p[2] & 0x80U) != 0) {
    if ((*p == -0x11) && (p[1] == -0x41)) {
      local_19 = true;
      if (0xbd < (byte)p[2]) goto LAB_00a29747;
    }
    else {
      local_19 = true;
      if ((p[2] & 0xc0U) == 0xc0) goto LAB_00a29747;
    }
    if (*p == -0x20) {
      local_19 = true;
      if (0x9f < (byte)p[1]) {
        local_19 = (p[1] & 0xc0U) == 0xc0;
      }
    }
    else {
      local_19 = true;
      if ((p[1] & 0x80U) != 0) {
        if (*p == -0x13) {
          local_19 = 0x9f < (byte)p[1];
        }
        else {
          local_19 = (p[1] & 0xc0U) == 0xc0;
        }
      }
    }
  }
LAB_00a29747:
  return (int)local_19;
}

Assistant:

static int PTRFASTCALL
utf8_isInvalid3(const ENCODING *UNUSED_P(enc), const char *p)
{
  return UTF8_INVALID3((const unsigned char *)p);
}